

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Types TVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  long *plVar13;
  SPIRVariable *var;
  runtime_error *prVar14;
  size_type *psVar15;
  ulong *puVar16;
  ulong uVar17;
  uint uVar18;
  CompilerMSL *pCVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  bool bVar22;
  AccessChainMeta meta;
  string expr;
  uint32_t indices [2];
  string local_140;
  SPIRType *local_120;
  CompilerMSL *local_118;
  uint32_t local_10c;
  undefined1 local_108 [16];
  ulong local_f8;
  long lStack_f0;
  uint32_t local_e4;
  ulong local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  SPIRType *local_78;
  uint32_t local_6c;
  SPIRType *local_68;
  SPIRType *local_60;
  uint32_t local_54;
  SPIRType *local_50;
  uint32_t local_44;
  SPIRVariable *local_40;
  ulong local_38;
  
  pSVar10 = Compiler::expression_type((Compiler *)this,ptr);
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type_id);
  local_118 = this;
  local_50 = pSVar10;
  if (((pSVar10->storage != StorageClassInput) &&
      ((pSVar10->storage != StorageClassOutput ||
       (EVar7 = Compiler::get_execution_model((Compiler *)this),
       EVar7 == ExecutionModelTessellationEvaluation)))) ||
     (bVar4 = Compiler::has_decoration((Compiler *)this,(ID)ptr,DecorationPatch), bVar4)) {
    return false;
  }
  TVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[ptr].type;
  local_e4 = ptr;
  local_54 = id;
  local_44 = result_type_id;
  bVar4 = variable_storage_requires_stage_io(this,local_50->storage);
  if (bVar4) {
    bVar5 = Compiler::is_matrix((Compiler *)this,pSVar11);
    bVar22 = true;
    if ((!bVar5) && (bVar5 = Compiler::is_array((Compiler *)this,pSVar11), !bVar5)) {
      bVar22 = *(int *)&(pSVar11->super_IVariant).field_0xc == 0xf;
    }
  }
  else {
    bVar22 = false;
  }
  bVar5 = bVar22;
  if (TVar2 == TypeVariable) {
    bVar6 = Compiler::is_array((Compiler *)local_118,pSVar11);
    bVar5 = true;
    if (!bVar6) {
      bVar5 = bVar22;
    }
  }
  uVar9 = local_e4;
  pCVar19 = local_118;
  if (!bVar5) {
    return false;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_120 = pSVar11;
  uVar8 = Compiler::get_extended_decoration
                    ((Compiler *)local_118,local_e4,SPIRVCrossDecorationInterfaceMemberIndex);
  local_e0 = CONCAT44(extraout_var,uVar8);
  local_40 = Compiler::maybe_get_backing_variable((Compiler *)pCVar19,uVar9);
  local_68 = Compiler::get_pointee_type((Compiler *)pCVar19,(local_50->super_IVariant).self.id);
  local_60 = Compiler::expression_type((Compiler *)pCVar19,(pCVar19->stage_in_ptr_var_id).id);
  pCVar19 = local_118;
  if (bVar4) {
    uVar17 = (local_120->array).super_VectorView<unsigned_int>.buffer_size;
    if (2 < uVar17) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,
                 "Cannot load tessellation IO variables with more than 2 dimensions.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
      *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar17 == 2) {
      if (TVar2 != TypeVariable) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,
                   "Loading an array-of-array must be loaded directly from an IO variable.","");
        ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
        *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((int)local_e0 == -1) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Interface index is unknown. Cannot continue.","");
        ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
        *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((*(int *)&(local_120->super_IVariant).field_0xc == 0xf) ||
         (bVar4 = Compiler::is_matrix((Compiler *)local_118,local_120), bVar4)) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,
                   "Cannot load array-of-array of composite type in tessellation IO.","");
        ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
        *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_108,pCVar19,local_120,0);
      puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_108);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar15 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_140.field_2._M_allocated_capacity = *psVar15;
        local_140.field_2._8_8_ = puVar12[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar15;
        local_140._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_140._M_string_length = puVar12[1];
      *puVar12 = psVar15;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((ulong *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_);
      }
      pSVar10 = local_120;
      uVar8 = CompilerGLSL::to_array_size_literal(&pCVar19->super_CompilerGLSL,local_120,1);
      pSVar10 = Variant::get<spirv_cross::SPIRType>
                          ((pCVar19->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar10->parent_type).id);
      if (uVar8 != 0) {
        local_10c = 0;
        local_78 = (SPIRType *)CONCAT44(local_78._4_4_,uVar8);
        do {
          pCVar19 = local_118;
          (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    ((AccessChainMeta *)local_108,local_118,pSVar10,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_108);
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_108._0_8_ != &local_f8) {
            operator_delete((void *)local_108._0_8_);
          }
          uVar9 = CompilerGLSL::to_array_size_literal(&pCVar19->super_CompilerGLSL,local_120,0);
          if (uVar9 != 0) {
            uVar17 = local_e0 & 0xffffffff;
            uVar18 = 1;
            do {
              local_98._M_dataplus._M_p._0_4_ = local_10c;
              local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
              local_108._0_8_ = (ulong *)0x0;
              local_98._M_dataplus._M_p._4_4_ = (uint32_t)uVar17;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_140,&local_118->super_CompilerGLSL,
                         (local_118->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                         (AccessChainMeta *)local_108);
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              bVar4 = Compiler::is_matrix((Compiler *)local_118,pSVar10);
              if ((!bVar4 && *(int *)&(pSVar10->super_IVariant).field_0xc != 0xf) &&
                 (pSVar10->vecsize < local_68->vecsize)) {
                CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              if (uVar18 < uVar9) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              uVar17 = (ulong)((uint32_t)uVar17 + 1);
              bVar4 = uVar18 != uVar9;
              uVar18 = uVar18 + 1;
            } while (bVar4);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar18 = (uint)local_78;
          local_10c = local_10c + 1;
          if (local_10c < (uint)local_78) {
            ::std::__cxx11::string::append((char *)&local_b8);
          }
          uVar9 = local_e4;
        } while (local_10c != uVar18);
      }
      ::std::__cxx11::string::append((char *)&local_b8);
    }
    else if (*(int *)&(local_120->super_IVariant).field_0xc == 0xf) {
      bVar4 = Compiler::is_array((Compiler *)local_118,local_120);
      pSVar10 = local_120;
      local_10c = CONCAT31(local_10c._1_3_,bVar4);
      if ((TVar2 != TypeVariable) && (bVar4)) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,
                   "Loading array of struct from IO variable must come directly from IO variable.",
                   "");
        ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
        *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_6c = 1;
      if (bVar4) {
        local_6c = CompilerGLSL::to_array_size_literal(&pCVar19->super_CompilerGLSL,local_120,0);
        (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_108,pCVar19,pSVar10,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
        psVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140.field_2._8_8_ = puVar12[3];
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        uVar9 = local_e4;
        if ((ulong *)local_108._0_8_ != &local_f8) {
          operator_delete((void *)local_108._0_8_);
        }
      }
      if ((char)local_10c != '\0') {
        local_120 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar19->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (local_120->parent_type).id);
        pCVar19 = local_118;
      }
      if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x1df7,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      if (local_6c != 0) {
        local_78 = (SPIRType *)0x0;
        do {
          (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_108,pCVar19,local_120,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140.field_2._8_8_ = puVar12[3];
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_108._0_8_ != &local_f8) {
            operator_delete((void *)local_108._0_8_);
          }
          if ((int)(local_120->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0)
          {
            uVar17 = 0;
            do {
              if (local_40 != (SPIRVariable *)0x0) {
                uVar8 = Compiler::get_extended_member_decoration
                                  ((Compiler *)pCVar19,(local_40->super_IVariant).self.id,
                                   (uint32_t)uVar17,SPIRVCrossDecorationInterfaceMemberIndex);
                local_e0 = CONCAT44(extraout_var_00,uVar8);
              }
              if ((int)local_e0 == -1) {
                prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_140,"Interface index is unknown. Cannot continue.","");
                ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
                *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              pSVar10 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar19->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (local_120->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar17].id);
              local_38 = uVar17;
              pSVar11 = Variant::get<spirv_cross::SPIRType>
                                  ((pCVar19->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (local_68->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[uVar17].id);
              bVar4 = Compiler::is_matrix((Compiler *)pCVar19,pSVar10);
              if (bVar4 && local_50->storage == StorageClassInput) {
                (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_108,pCVar19,pSVar10,0);
                puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                psVar15 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_140.field_2._M_allocated_capacity = *psVar15;
                  local_140.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_140.field_2._M_allocated_capacity = *psVar15;
                  local_140._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_140._M_string_length = puVar12[1];
                *puVar12 = psVar15;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p);
                }
                if ((ulong *)local_108._0_8_ != &local_f8) {
                  operator_delete((void *)local_108._0_8_);
                }
                if (pSVar10->columns != 0) {
                  uVar18 = 0;
                  do {
                    uVar8 = (int)local_e0 + uVar18;
                    if ((char)local_10c == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_98,&local_118->super_CompilerGLSL,uVar9,true);
                      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_98);
                      local_108._0_8_ = &local_f8;
                      puVar16 = (ulong *)(plVar13 + 2);
                      if ((ulong *)*plVar13 == puVar16) {
                        local_f8 = *puVar16;
                        lStack_f0 = plVar13[3];
                      }
                      else {
                        local_f8 = *puVar16;
                        local_108._0_8_ = (ulong *)*plVar13;
                      }
                      local_108._8_8_ = plVar13[1];
                      *plVar13 = (long)puVar16;
                      plVar13[1] = 0;
                      *(undefined1 *)(plVar13 + 2) = 0;
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_d8,&local_118->super_CompilerGLSL,local_60,uVar8);
                      uVar17 = 0xf;
                      if ((ulong *)local_108._0_8_ != &local_f8) {
                        uVar17 = local_f8;
                      }
                      if (uVar17 < local_d8._M_string_length + local_108._8_8_) {
                        uVar20 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                          uVar20 = local_d8.field_2._M_allocated_capacity;
                        }
                        if ((ulong)uVar20 < local_d8._M_string_length + local_108._8_8_)
                        goto LAB_002c225e;
                        puVar12 = (undefined8 *)
                                  ::std::__cxx11::string::replace
                                            ((ulong)&local_d8,0,(char *)0x0,local_108._0_8_);
                      }
                      else {
LAB_002c225e:
                        puVar12 = (undefined8 *)
                                  ::std::__cxx11::string::_M_append
                                            (local_108,(ulong)local_d8._M_dataplus._M_p);
                      }
                      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                      psVar15 = puVar12 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar12 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar15) {
                        local_140.field_2._M_allocated_capacity = *psVar15;
                        local_140.field_2._8_8_ = puVar12[3];
                      }
                      else {
                        local_140.field_2._M_allocated_capacity = *psVar15;
                        local_140._M_dataplus._M_p = (pointer)*puVar12;
                      }
                      local_140._M_string_length = puVar12[1];
                      *puVar12 = psVar15;
                      puVar12[1] = 0;
                      *(undefined1 *)psVar15 = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_140._M_dataplus._M_p != &local_140.field_2) {
                        operator_delete(local_140._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                        operator_delete(local_d8._M_dataplus._M_p);
                      }
                      if ((ulong *)local_108._0_8_ != &local_f8) {
                        operator_delete((void *)local_108._0_8_);
                      }
                      _Var21._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                      (uint32_t)local_98._M_dataplus._M_p);
                      psVar3 = &local_98;
                    }
                    else {
                      local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_78;
                      local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
                      local_108._0_8_ = (ulong *)0x0;
                      local_98._M_dataplus._M_p._4_4_ = uVar8;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (&local_140,&local_118->super_CompilerGLSL,
                                 (local_118->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                                 (AccessChainMeta *)local_108);
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                      psVar3 = &local_140;
                      _Var21._M_p = local_140._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var21._M_p != &psVar3->field_2) {
                      operator_delete(_Var21._M_p);
                    }
                    if (pSVar10->vecsize < pSVar11->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_b8);
                    }
                    uVar18 = uVar18 + 1;
                    if (uVar18 < pSVar10->columns) {
                      ::std::__cxx11::string::append((char *)&local_b8);
                    }
                  } while (uVar18 < pSVar10->columns);
                  local_e0 = (ulong)((int)local_e0 + uVar18);
                }
                ::std::__cxx11::string::append((char *)&local_b8);
                pCVar19 = local_118;
              }
              else {
                bVar4 = Compiler::is_array((Compiler *)pCVar19,pSVar10);
                if (bVar4) {
                  (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (local_108,pCVar19,pSVar10,0);
                  puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                  psVar15 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_140.field_2._M_allocated_capacity = *psVar15;
                    local_140.field_2._8_8_ = puVar12[3];
                  }
                  else {
                    local_140.field_2._M_allocated_capacity = *psVar15;
                    local_140._M_dataplus._M_p = (pointer)*puVar12;
                  }
                  local_140._M_string_length = puVar12[1];
                  *puVar12 = psVar15;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if ((ulong *)local_108._0_8_ != &local_f8) {
                    operator_delete((void *)local_108._0_8_);
                  }
                  uVar9 = CompilerGLSL::to_array_size_literal
                                    (&pCVar19->super_CompilerGLSL,pSVar10,0);
                  if (uVar9 != 0) {
                    uVar18 = 1;
                    do {
                      if ((char)local_10c == '\0') {
                        CompilerGLSL::to_expression_abi_cxx11_
                                  (&local_98,&local_118->super_CompilerGLSL,local_e4,true);
                        puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                        local_108._0_8_ = &local_f8;
                        puVar16 = puVar12 + 2;
                        if ((ulong *)*puVar12 == puVar16) {
                          local_f8 = *puVar16;
                          lStack_f0 = puVar12[3];
                        }
                        else {
                          local_f8 = *puVar16;
                          local_108._0_8_ = (ulong *)*puVar12;
                        }
                        local_108._8_8_ = puVar12[1];
                        *puVar12 = puVar16;
                        puVar12[1] = 0;
                        *(undefined1 *)(puVar12 + 2) = 0;
                        CompilerGLSL::to_member_name_abi_cxx11_
                                  (&local_d8,&local_118->super_CompilerGLSL,local_60,
                                   (uint32_t)local_e0);
                        uVar17 = 0xf;
                        if ((ulong *)local_108._0_8_ != &local_f8) {
                          uVar17 = local_f8;
                        }
                        if (uVar17 < local_d8._M_string_length + local_108._8_8_) {
                          uVar20 = 0xf;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                            uVar20 = local_d8.field_2._M_allocated_capacity;
                          }
                          if ((ulong)uVar20 < local_d8._M_string_length + local_108._8_8_)
                          goto LAB_002c25ea;
                          puVar12 = (undefined8 *)
                                    ::std::__cxx11::string::replace
                                              ((ulong)&local_d8,0,(char *)0x0,local_108._0_8_);
                        }
                        else {
LAB_002c25ea:
                          puVar12 = (undefined8 *)
                                    ::std::__cxx11::string::_M_append
                                              (local_108,(ulong)local_d8._M_dataplus._M_p);
                        }
                        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                        psVar15 = puVar12 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar12 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar15) {
                          local_140.field_2._M_allocated_capacity = *psVar15;
                          local_140.field_2._8_8_ = puVar12[3];
                        }
                        else {
                          local_140.field_2._M_allocated_capacity = *psVar15;
                          local_140._M_dataplus._M_p = (pointer)*puVar12;
                        }
                        local_140._M_string_length = puVar12[1];
                        *puVar12 = psVar15;
                        puVar12[1] = 0;
                        *(undefined1 *)psVar15 = 0;
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_140._M_dataplus._M_p != &local_140.field_2) {
                          operator_delete(local_140._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                          operator_delete(local_d8._M_dataplus._M_p);
                        }
                        if ((ulong *)local_108._0_8_ != &local_f8) {
                          operator_delete((void *)local_108._0_8_);
                        }
                        _Var21._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                        (uint32_t)local_98._M_dataplus._M_p);
                        psVar3 = &local_98;
                      }
                      else {
                        local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_78;
                        local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
                        local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
                        local_108._0_8_ = (ulong *)0x0;
                        CompilerGLSL::access_chain_internal_abi_cxx11_
                                  (&local_140,&local_118->super_CompilerGLSL,
                                   (local_118->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                                   (AccessChainMeta *)local_108);
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                        psVar3 = &local_140;
                        _Var21._M_p = local_140._M_dataplus._M_p;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var21._M_p != &psVar3->field_2) {
                        operator_delete(_Var21._M_p);
                      }
                      if (pSVar10->vecsize < pSVar11->vecsize) {
                        CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                        ::std::__cxx11::string::append((char *)&local_b8);
                      }
                      if (uVar18 < uVar9) {
                        ::std::__cxx11::string::append((char *)&local_b8);
                      }
                      local_e0 = (ulong)((int)local_e0 + 1);
                      bVar4 = uVar18 != uVar9;
                      uVar18 = uVar18 + 1;
                    } while (bVar4);
                  }
                  ::std::__cxx11::string::append((char *)&local_b8);
                  pCVar19 = local_118;
                  uVar9 = local_e4;
                }
                else {
                  if ((char)local_10c == '\0') {
                    CompilerGLSL::to_expression_abi_cxx11_
                              (&local_98,&pCVar19->super_CompilerGLSL,uVar9,true);
                    puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                    local_108._0_8_ = &local_f8;
                    puVar16 = puVar12 + 2;
                    if ((ulong *)*puVar12 == puVar16) {
                      local_f8 = *puVar16;
                      lStack_f0 = puVar12[3];
                    }
                    else {
                      local_f8 = *puVar16;
                      local_108._0_8_ = (ulong *)*puVar12;
                    }
                    local_108._8_8_ = puVar12[1];
                    *puVar12 = puVar16;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    CompilerGLSL::to_member_name_abi_cxx11_
                              (&local_d8,&pCVar19->super_CompilerGLSL,local_60,(uint32_t)local_e0);
                    uVar17 = 0xf;
                    if ((ulong *)local_108._0_8_ != &local_f8) {
                      uVar17 = local_f8;
                    }
                    if (uVar17 < local_d8._M_string_length + local_108._8_8_) {
                      uVar20 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                        uVar20 = local_d8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar20 < local_d8._M_string_length + local_108._8_8_)
                      goto LAB_002c27c7;
                      puVar12 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_d8,0,(char *)0x0,local_108._0_8_);
                    }
                    else {
LAB_002c27c7:
                      puVar12 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          (local_108,(ulong)local_d8._M_dataplus._M_p);
                    }
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    psVar15 = puVar12 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar15) {
                      local_140.field_2._M_allocated_capacity = *psVar15;
                      local_140.field_2._8_8_ = puVar12[3];
                    }
                    else {
                      local_140.field_2._M_allocated_capacity = *psVar15;
                      local_140._M_dataplus._M_p = (pointer)*puVar12;
                    }
                    local_140._M_string_length = puVar12[1];
                    *puVar12 = psVar15;
                    puVar12[1] = 0;
                    *(undefined1 *)psVar15 = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                      operator_delete(local_d8._M_dataplus._M_p);
                    }
                    if ((ulong *)local_108._0_8_ != &local_f8) {
                      operator_delete((void *)local_108._0_8_);
                    }
                    _Var21._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                    (uint32_t)local_98._M_dataplus._M_p);
                    psVar3 = &local_98;
                  }
                  else {
                    local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_78;
                    local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
                    local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
                    local_108._0_8_ = (ulong *)0x0;
                    CompilerGLSL::access_chain_internal_abi_cxx11_
                              (&local_140,&pCVar19->super_CompilerGLSL,
                               (pCVar19->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                               (AccessChainMeta *)local_108);
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                    psVar3 = &local_140;
                    _Var21._M_p = local_140._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var21._M_p != &psVar3->field_2) {
                    operator_delete(_Var21._M_p);
                  }
                  if (pSVar10->vecsize < pSVar11->vecsize) {
                    CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                }
              }
              uVar17 = local_38 + 1;
              if (uVar17 < (local_120->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar17 < (uint)(local_120->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    buffer_size);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar18 = (int)local_78 + 1;
          local_78 = (SPIRType *)(ulong)uVar18;
          if (uVar18 < local_6c) {
            ::std::__cxx11::string::append((char *)&local_b8);
          }
        } while ((uint32_t)local_78 != local_6c);
      }
      if ((char)local_10c != '\0') {
        ::std::__cxx11::string::append((char *)&local_b8);
      }
    }
    else {
      bVar4 = Compiler::is_matrix((Compiler *)local_118,local_120);
      if (bVar4) {
        bVar4 = Compiler::is_array((Compiler *)local_118,local_120);
        pCVar19 = local_118;
        pSVar10 = local_120;
        if ((TVar2 != TypeVariable) && (bVar4)) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                     ,"");
          ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
          *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((int)local_e0 == -1) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"Interface index is unknown. Cannot continue.","");
          ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
          *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (bVar4) {
          local_10c = CompilerGLSL::to_array_size_literal
                                (&local_118->super_CompilerGLSL,local_120,0);
          (*(pCVar19->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_108,pCVar19,pSVar10,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_108);
          paVar1 = &local_140.field_2;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_108._0_8_ != &local_f8) {
            operator_delete((void *)local_108._0_8_);
          }
          var = Variant::get<spirv_cross::SPIRVariable>
                          ((pCVar19->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + ptr);
          local_78 = Compiler::get_variable_element_type((Compiler *)local_118,var);
          if (local_10c != 0) {
            uVar9 = 0;
            do {
              (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((AccessChainMeta *)local_108,local_118,local_78,0);
              puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_108);
              psVar15 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_140.field_2._M_allocated_capacity = *psVar15;
                local_140.field_2._8_8_ = puVar12[3];
                local_140._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar15;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar15;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)local_108._0_8_ != &local_f8) {
                operator_delete((void *)local_108._0_8_);
              }
              if (local_120->columns != 0) {
                uVar18 = 0;
                do {
                  local_98._M_dataplus._M_p._4_4_ = (int)local_e0 + uVar18;
                  local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
                  local_108._0_8_ = (ulong *)0x0;
                  local_98._M_dataplus._M_p._0_4_ = uVar9;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&local_118->super_CompilerGLSL,
                             (local_118->stage_in_ptr_var_id).id,(uint32_t *)&local_98,2,5,
                             (AccessChainMeta *)local_108);
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != paVar1) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if (local_120->vecsize < local_68->vecsize) {
                    CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                  uVar18 = uVar18 + 1;
                  if (uVar18 < local_120->columns) {
                    ::std::__cxx11::string::append((char *)&local_b8);
                  }
                } while (uVar18 < local_120->columns);
              }
              ::std::__cxx11::string::append((char *)&local_b8);
              uVar9 = uVar9 + 1;
              if (uVar9 < local_10c) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar9 != local_10c);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar9 = local_e4;
        }
        else {
          (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_108,local_118,local_120,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
          paVar1 = &local_140.field_2;
          psVar15 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar15;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar15;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_108._0_8_ != &local_f8) {
            operator_delete((void *)local_108._0_8_);
          }
          if (local_120->columns != 0) {
            uVar18 = 0;
            do {
              CompilerGLSL::to_expression_abi_cxx11_
                        (&local_98,&local_118->super_CompilerGLSL,local_e4,true);
              puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
              puVar16 = puVar12 + 2;
              if ((ulong *)*puVar12 == puVar16) {
                local_f8 = *puVar16;
                lStack_f0 = puVar12[3];
                local_108._0_8_ = &local_f8;
              }
              else {
                local_f8 = *puVar16;
                local_108._0_8_ = (ulong *)*puVar12;
              }
              local_108._8_8_ = puVar12[1];
              *puVar12 = puVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_d8,&local_118->super_CompilerGLSL,local_60,(int)local_e0 + uVar18);
              uVar17 = 0xf;
              if ((ulong *)local_108._0_8_ != &local_f8) {
                uVar17 = local_f8;
              }
              if (uVar17 < local_d8._M_string_length + local_108._8_8_) {
                uVar20 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  uVar20 = local_d8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar20 < local_d8._M_string_length + local_108._8_8_) goto LAB_002c2ad2;
                puVar12 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_d8,0,(char *)0x0,local_108._0_8_);
              }
              else {
LAB_002c2ad2:
                puVar12 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_108,(ulong)local_d8._M_dataplus._M_p);
              }
              psVar15 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_140.field_2._M_allocated_capacity = *psVar15;
                local_140.field_2._8_8_ = puVar12[3];
                local_140._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar15;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar15;
              puVar12[1] = 0;
              *(undefined1 *)psVar15 = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if ((ulong *)local_108._0_8_ != &local_f8) {
                operator_delete((void *)local_108._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint32_t)local_98._M_dataplus._M_p)
                  != &local_98.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         (uint32_t)local_98._M_dataplus._M_p));
              }
              if (local_120->vecsize < local_68->vecsize) {
                CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b8);
              }
              uVar18 = uVar18 + 1;
              if (uVar18 < local_120->columns) {
                ::std::__cxx11::string::append((char *)&local_b8);
              }
            } while (uVar18 < local_120->columns);
          }
          ::std::__cxx11::string::append((char *)&local_b8);
          uVar9 = local_e4;
        }
      }
      else if (TVar2 == TypeVariable) {
        bVar4 = Compiler::is_array((Compiler *)local_118,local_120);
        pCVar19 = local_118;
        if (!bVar4) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1e8b,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1e8c,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e0 == -1) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"Interface index is unknown. Cannot continue.","");
          ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
          *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_108,local_118,local_120,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
        paVar1 = &local_140.field_2;
        psVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140.field_2._8_8_ = puVar12[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)local_108._0_8_ != &local_f8) {
          operator_delete((void *)local_108._0_8_);
        }
        uVar9 = CompilerGLSL::to_array_size_literal(&pCVar19->super_CompilerGLSL,local_120,0);
        if (uVar9 != 0) {
          uVar8 = 0;
          do {
            local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
            local_108._0_8_ = (ulong *)0x0;
            local_98._M_dataplus._M_p._0_4_ = uVar8;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      (&local_140,&local_118->super_CompilerGLSL,(local_118->stage_in_ptr_var_id).id
                       ,(uint32_t *)&local_98,2,5,(AccessChainMeta *)local_108);
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b8);
            }
            uVar8 = uVar8 + 1;
            if (uVar8 < uVar9) {
              ::std::__cxx11::string::append((char *)&local_b8);
            }
          } while (uVar9 != uVar8);
        }
        ::std::__cxx11::string::append((char *)&local_b8);
        uVar9 = local_e4;
      }
      else {
        bVar4 = Compiler::is_array((Compiler *)local_118,local_120);
        pCVar19 = local_118;
        if (!bVar4) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1ea7,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1ea8,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e0 == -1) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"Interface index is unknown. Cannot continue.","");
          ::std::runtime_error::runtime_error(prVar14,(string *)&local_140);
          *(undefined ***)prVar14 = &PTR__runtime_error_003fce08;
          __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_108,local_118,local_120,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
        paVar1 = &local_140.field_2;
        psVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140.field_2._8_8_ = puVar12[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar15;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)local_108._0_8_ != &local_f8) {
          operator_delete((void *)local_108._0_8_);
        }
        uVar9 = CompilerGLSL::to_array_size_literal(&pCVar19->super_CompilerGLSL,local_120,0);
        if (uVar9 != 0) {
          uVar18 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_98,&local_118->super_CompilerGLSL,local_e4,true);
            puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            puVar16 = puVar12 + 2;
            if ((ulong *)*puVar12 == puVar16) {
              local_f8 = *puVar16;
              lStack_f0 = puVar12[3];
              local_108._0_8_ = &local_f8;
            }
            else {
              local_f8 = *puVar16;
              local_108._0_8_ = (ulong *)*puVar12;
            }
            local_108._8_8_ = puVar12[1];
            *puVar12 = puVar16;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_d8,&local_118->super_CompilerGLSL,local_60,(int)local_e0 + uVar18);
            uVar17 = 0xf;
            if ((ulong *)local_108._0_8_ != &local_f8) {
              uVar17 = local_f8;
            }
            if (uVar17 < local_d8._M_string_length + local_108._8_8_) {
              uVar20 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar20 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 < local_d8._M_string_length + local_108._8_8_) goto LAB_002c311f;
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_d8,0,(char *)0x0,local_108._0_8_);
            }
            else {
LAB_002c311f:
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_108,(ulong)local_d8._M_dataplus._M_p);
            }
            psVar15 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_140.field_2._M_allocated_capacity = *psVar15;
              local_140.field_2._8_8_ = puVar12[3];
              local_140._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar15;
              local_140._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_140._M_string_length = puVar12[1];
            *puVar12 = psVar15;
            puVar12[1] = 0;
            *(undefined1 *)psVar15 = 0;
            ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            if ((ulong *)local_108._0_8_ != &local_f8) {
              operator_delete((void *)local_108._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint32_t)local_98._M_dataplus._M_p) !=
                &local_98.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_98._M_dataplus._M_p));
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b8);
            }
            uVar18 = uVar18 + 1;
            if (uVar18 < uVar9) {
              ::std::__cxx11::string::append((char *)&local_b8);
            }
          } while (uVar9 != uVar18);
        }
        ::std::__cxx11::string::append((char *)&local_b8);
        uVar9 = local_e4;
      }
    }
  }
  else {
    if ((int)local_e0 == -1) {
      bVar4 = false;
      goto LAB_002c1b87;
    }
    (*(local_118->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_108,local_118,local_120,0);
    puVar12 = (undefined8 *)::std::__cxx11::string::append(local_108);
    paVar1 = &local_140.field_2;
    psVar15 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_140.field_2._M_allocated_capacity = *psVar15;
      local_140.field_2._8_8_ = puVar12[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar15;
      local_140._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_140._M_string_length = puVar12[1];
    *puVar12 = psVar15;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((ulong *)local_108._0_8_ != &local_f8) {
      operator_delete((void *)local_108._0_8_);
    }
    uVar9 = CompilerGLSL::to_array_size_literal
                      (&pCVar19->super_CompilerGLSL,local_120,
                       (int)(local_120->array).super_VectorView<unsigned_int>.buffer_size - 1);
    if (uVar9 != 0) {
      uVar8 = 0;
      do {
        local_98._M_dataplus._M_p._4_4_ = (uint32_t)local_e0;
        local_108._8_8_ = local_108._8_8_ & 0xffffffffffff0000;
        local_108._0_8_ = (ulong *)0x0;
        local_98._M_dataplus._M_p._0_4_ = uVar8;
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  (&local_140,&local_118->super_CompilerGLSL,(local_118->stage_in_ptr_var_id).id,
                   (uint32_t *)&local_98,2,5,(AccessChainMeta *)local_108);
        ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        uVar8 = uVar8 + 1;
        if (uVar8 < uVar9) {
          ::std::__cxx11::string::append((char *)&local_b8);
        }
      } while (uVar9 != uVar8);
    }
    ::std::__cxx11::string::append((char *)&local_b8);
    uVar9 = local_e4;
  }
  pCVar19 = local_118;
  CompilerGLSL::emit_op(&local_118->super_CompilerGLSL,local_44,local_54,&local_b8,false,false);
  bVar4 = true;
  Compiler::register_read((Compiler *)pCVar19,local_54,uVar9,false);
LAB_002c1b87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}